

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_bitmap_of_32(void **param_1)

{
  bool bVar1;
  size_type in_RCX;
  size_type sVar2;
  Roaring *this;
  char *__format;
  initializer_list<unsigned_int> l;
  initializer_list<unsigned_int> l_00;
  initializer_list<unsigned_int> l_01;
  initializer_list<unsigned_int> l_02;
  undefined1 local_c4 [12];
  Roaring r3a;
  Roaring r1;
  Roaring r2;
  Roaring r1d;
  
  this = &r2;
  r2.roaring.high_low_container.size = 1;
  r2.roaring.high_low_container.allocation_size = 2;
  r2.roaring.high_low_container.containers._0_4_ = 4;
  __format = (char *)0x3;
  l._M_len = in_RCX;
  l._M_array = (iterator)0x3;
  roaring::Roaring::bitmapOfList(&r1,this,l);
  roaring::Roaring::printf(&r1,(char *)this);
  putchar(10);
  roaring::Roaring::bitmapOf(&r2,3,1,2,4);
  roaring::Roaring::printf(&r2,__format);
  putchar(10);
  bVar1 = roaring::Roaring::operator==(&r1,&r2);
  _assert_true((ulong)bVar1,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x372);
  r3a.roaring.high_low_container.size = 1;
  r3a.roaring.high_low_container.allocation_size = 2;
  r3a.roaring.high_low_container.containers._0_4_ = 4;
  l_01._M_len = 3;
  l_01._M_array = (iterator)&r3a;
  roaring::Roaring::Roaring(&r1d,l_01);
  bVar1 = roaring::Roaring::operator==(&r1,&r1d);
  sVar2 = 0x375;
  _assert_true((ulong)bVar1,"r1 == r1d",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x375);
  local_c4._0_4_ = 7;
  local_c4._4_4_ = 8;
  local_c4._8_4_ = 9;
  l_00._M_len = sVar2;
  l_00._M_array = (iterator)0x3;
  roaring::Roaring::bitmapOfList(&r3a,(Roaring *)local_c4,l_00);
  local_c4._0_4_ = 1;
  local_c4._4_4_ = 2;
  local_c4._8_4_ = 4;
  l_02._M_len = 3;
  l_02._M_array = (iterator)local_c4;
  roaring::Roaring::operator=(&r3a,l_02);
  bVar1 = roaring::Roaring::operator==(&r1,&r3a);
  _assert_true((ulong)bVar1,"r1 == r3a",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x379);
  roaring::Roaring::~Roaring(&r3a);
  roaring::Roaring::~Roaring(&r1d);
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  return;
}

Assistant:

DEFINE_TEST(test_bitmap_of_32) {
    Roaring r1 = Roaring::bitmapOfList({1, 2, 4});
    r1.printf();
    printf("\n");
    Roaring r2 = Roaring::bitmapOf(3, 1, 2, 4);
    r2.printf();
    printf("\n");
    assert_true(r1 == r2);

    Roaring r1d = {1, 2, 4};
    assert_true(r1 == r1d);

    Roaring r3a = Roaring::bitmapOfList({7, 8, 9});
    r3a = {1, 2, 4};  // overwrite with assignment operator
    assert_true(r1 == r3a);
}